

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O1

SyntaxTreeNode * __thiscall
RegexToDFAConverter::expression_eval(RegexToDFAConverter *this,string *expr,int *curr_pos)

{
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *this_00;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *this_01;
  pointer *pppSVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  SyntaxTreeNode *this_02;
  __hashtable *__h_1;
  __hashtable *__h;
  _Hash_node_base *p_Var5;
  SyntaxTreeNode *son;
  int it;
  SyntaxTreeNode *local_60;
  undefined4 local_54;
  string *local_50;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_48;
  int *local_40;
  RegexToDFAConverter *local_38;
  
  this_02 = (SyntaxTreeNode *)operator_new(0x90);
  (this_02->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_02->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_02->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this_02->first_pos;
  (this_02->first_pos)._M_h._M_buckets = &(this_02->first_pos)._M_h._M_single_bucket;
  (this_02->first_pos)._M_h._M_bucket_count = 1;
  (this_02->first_pos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_02->first_pos)._M_h._M_element_count = 0;
  (this_02->first_pos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_02->first_pos)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_02->first_pos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this_02->last_pos)._M_h._M_buckets = &(this_02->last_pos)._M_h._M_single_bucket;
  (this_02->last_pos)._M_h._M_bucket_count = 1;
  (this_02->last_pos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_02->last_pos)._M_h._M_element_count = 0;
  (this_02->last_pos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_02->last_pos)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_02->last_pos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this_02->last_pos)._M_h._M_single_bucket + 5) = 0;
  local_50 = expr;
  local_38 = this;
  local_60 = term_eval(this,expr,curr_pos);
  if (local_60 != this_02) {
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00,&(local_60->first_pos)._M_h);
  }
  this_01 = &this_02->last_pos;
  if (local_60 != this_02) {
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_01,&(local_60->last_pos)._M_h);
  }
  iVar2._M_current =
       (this_02->sons).
       super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this_02->sons).
      super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<RegexToDFAConverter::SyntaxTreeNode*,std::allocator<RegexToDFAConverter::SyntaxTreeNode*>>
    ::_M_realloc_insert<RegexToDFAConverter::SyntaxTreeNode*const&>
              ((vector<RegexToDFAConverter::SyntaxTreeNode*,std::allocator<RegexToDFAConverter::SyntaxTreeNode*>>
                *)this_02,iVar2,&local_60);
  }
  else {
    *iVar2._M_current = local_60;
    pppSVar1 = &(this_02->sons).
                super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  this_02->nullable = local_60->nullable;
  iVar4 = *curr_pos;
  if (iVar4 < (int)local_50->_M_string_length) {
    local_40 = curr_pos;
    do {
      if ((local_50->_M_dataplus)._M_p[iVar4] != '|') break;
      *local_40 = iVar4 + 1;
      local_60 = term_eval(local_38,local_50,local_40);
      iVar2._M_current =
           (this_02->sons).
           super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this_02->sons).
          super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<RegexToDFAConverter::SyntaxTreeNode*,std::allocator<RegexToDFAConverter::SyntaxTreeNode*>>
        ::_M_realloc_insert<RegexToDFAConverter::SyntaxTreeNode*const&>
                  ((vector<RegexToDFAConverter::SyntaxTreeNode*,std::allocator<RegexToDFAConverter::SyntaxTreeNode*>>
                    *)this_02,iVar2,&local_60);
      }
      else {
        *iVar2._M_current = local_60;
        pppSVar1 = &(this_02->sons).
                    super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
      bVar3 = true;
      if (this_02->nullable == false) {
        bVar3 = local_60->nullable;
      }
      this_02->nullable = bVar3;
      for (p_Var5 = (local_60->first_pos)._M_h._M_before_begin._M_nxt;
          p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        local_54 = *(undefined4 *)&p_Var5[1]._M_nxt;
        local_48 = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00,&local_54,&local_48);
      }
      for (p_Var5 = (local_60->last_pos)._M_h._M_before_begin._M_nxt;
          p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        local_54 = *(undefined4 *)&p_Var5[1]._M_nxt;
        local_48 = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_01;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_01,&local_54,&local_48);
      }
      iVar4 = *local_40;
    } while (iVar4 < (int)local_50->_M_string_length);
  }
  SyntaxTreeNode::wipe_sons(this_02);
  return this_02;
}

Assistant:

RegexToDFAConverter::SyntaxTreeNode* RegexToDFAConverter::expression_eval(
    const string &expr, int &curr_pos) {

  SyntaxTreeNode* root = new SyntaxTreeNode;
  auto son = term_eval(expr, curr_pos);
  root->first_pos = son->first_pos;
  root->last_pos = son->last_pos;
  root->sons.push_back(son);
  root->nullable = son->nullable;

  while (curr_pos < (int)expr.size() && expr[curr_pos] == '|') {
    son = term_eval(expr, ++curr_pos);
    root->sons.push_back(son);
    root->nullable = (root->nullable || son->nullable);
    for (int it : son->first_pos)
      root->first_pos.insert(it);
    for (int it : son->last_pos)
      root->last_pos.insert(it);
  }

  root->wipe_sons();
  return root;
}